

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O3

void spvtools::CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
               (BasicBlock *entry,get_blocks_func *successor_func,
               function<void_(const_spvtools::val::BasicBlock_*)> *preorder,
               function<void_(const_spvtools::val::BasicBlock_*)> *postorder,
               function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)>
               *backedge,function<bool_(const_spvtools::val::BasicBlock_*)> *terminal)

{
  uint uVar1;
  pointer ppBVar2;
  BasicBlock *pBVar3;
  _Hash_node_base *p_Var4;
  pointer pbVar5;
  bool bVar6;
  block_info *b;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar7;
  block_info *pbVar8;
  uint32_t uVar9;
  __node_gen_type __node_gen;
  vector<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
  work_list;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  processed;
  BasicBlock *local_b0;
  block_info local_a8;
  vector<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
  local_98;
  _Any_data *local_78;
  _Any_data *local_70;
  undefined1 local_68 [40];
  pointer local_40;
  __node_base_ptr p_Stack_38;
  
  local_70 = (_Any_data *)backedge;
  if ((successor_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
    __assert_fail("successor_func && \"The successor function cannot be empty.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h"
                  ,0xb4,
                  "static void spvtools::CFA<spvtools::val::BasicBlock>::DepthFirstTraversal(const BB *, get_blocks_func, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr, cbb_ptr)>, std::function<bool (cbb_ptr)>) [BB = spvtools::val::BasicBlock]"
                 );
  }
  if ((preorder->super__Function_base)._M_manager == (_Manager_type)0x0) {
    __assert_fail("preorder && \"The preorder function cannot be empty.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h"
                  ,0xb5,
                  "static void spvtools::CFA<spvtools::val::BasicBlock>::DepthFirstTraversal(const BB *, get_blocks_func, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr, cbb_ptr)>, std::function<bool (cbb_ptr)>) [BB = spvtools::val::BasicBlock]"
                 );
  }
  if ((postorder->super__Function_base)._M_manager == (_Manager_type)0x0) {
    __assert_fail("postorder && \"The postorder function cannot be empty.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h"
                  ,0xb6,
                  "static void spvtools::CFA<spvtools::val::BasicBlock>::DepthFirstTraversal(const BB *, get_blocks_func, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr, cbb_ptr)>, std::function<bool (cbb_ptr)>) [BB = spvtools::val::BasicBlock]"
                 );
  }
  local_78 = (_Any_data *)preorder;
  if ((terminal->super__Function_base)._M_manager == (_Manager_type)0x0) {
    __assert_fail("terminal && \"The terminal function cannot be empty.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h"
                  ,0xb7,
                  "static void spvtools::CFA<spvtools::val::BasicBlock>::DepthFirstTraversal(const BB *, get_blocks_func, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr)>, std::function<void (cbb_ptr, cbb_ptr)>, std::function<bool (cbb_ptr)>) [BB = spvtools::val::BasicBlock]"
                 );
  }
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = (BasicBlock *)0x1;
  local_68._16_8_ = (BasicBlock *)0x0;
  local_68._24_8_ = (BasicBlock *)0x0;
  local_68._32_4_ = 1.0;
  local_40 = (pointer)0x0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_98.
  super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (block_info *)0x0;
  local_98.
  super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (block_info *)0x0;
  local_98.
  super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (block_info *)0x0;
  std::
  vector<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
  ::reserve(&local_98,10);
  local_b0 = entry;
  local_a8.block = entry;
  if ((successor_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_b0 = entry;
    local_a8.block = entry;
    pvVar7 = (*successor_func->_M_invoker)((_Any_data *)successor_func,&local_b0);
    ppBVar2 = (pvVar7->
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_a8.iter._M_current = ppBVar2;
    if (local_98.
        super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_98.
        super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
      ::_M_realloc_insert<spvtools::CFA<spvtools::val::BasicBlock>::block_info>
                (&local_98,
                 (iterator)
                 local_98.
                 super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_a8);
    }
    else {
      local_a8.iter._M_current._0_4_ = SUB84(ppBVar2,0);
      local_a8.iter._M_current._4_4_ = (undefined4)((ulong)ppBVar2 >> 0x20);
      *(undefined4 *)
       &(local_98.
         super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
         ._M_impl.super__Vector_impl_data._M_finish)->block = local_a8.block._0_4_;
      *(undefined4 *)
       ((long)&(local_98.
                super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                ._M_impl.super__Vector_impl_data._M_finish)->block + 4) = local_a8.block._4_4_;
      *(undefined4 *)
       &((local_98.
          super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
          ._M_impl.super__Vector_impl_data._M_finish)->iter)._M_current =
           local_a8.iter._M_current._0_4_;
      *(undefined4 *)
       ((long)&((local_98.
                 super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->iter)._M_current + 4) =
           local_a8.iter._M_current._4_4_;
      local_98.
      super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_a8.block = entry;
    if (*(long *)(local_78 + 1) != 0) {
      local_a8.block = entry;
      (**(code **)(local_78->_M_pod_data + 0x18))(local_78,&local_a8.block);
      local_b0 = (BasicBlock *)CONCAT44(local_b0._4_4_,entry->id_);
      local_a8.block = (cbb_ptr)local_68;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_a8.block,&local_b0,&local_a8);
      if (local_98.
          super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pbVar5 = local_98.
                   super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_a8.block =
               local_98.
               super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].block;
          if ((terminal->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001ae65e;
          bVar6 = (*terminal->_M_invoker)((_Any_data *)terminal,&local_a8.block);
          if (bVar6) {
LAB_001ae4fa:
            local_a8.block = pbVar5[-1].block;
            if ((postorder->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_001ae65e;
            (*postorder->_M_invoker)((_Any_data *)postorder,&local_a8.block);
            local_98.
            super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_98.
                 super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          else {
            local_a8.block = pbVar5[-1].block;
            if ((successor_func->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_001ae65e;
            pvVar7 = (*successor_func->_M_invoker)((_Any_data *)successor_func,&local_a8.block);
            ppBVar2 = pbVar5[-1].iter._M_current;
            if (ppBVar2 ==
                (pvVar7->
                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                )._M_impl.super__Vector_impl_data._M_finish) goto LAB_001ae4fa;
            pBVar3 = *ppBVar2;
            pbVar5[-1].iter._M_current = ppBVar2 + 1;
            uVar9 = pBVar3->id_;
            pbVar8 = local_98.
                     super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (*(long *)(local_70 + 1) != 0) {
              for (; pbVar8 != local_98.
                               super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                               ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
                if (pbVar8->block->id_ == uVar9) {
                  local_a8.block = pbVar5[-1].block;
                  local_b0 = pBVar3;
                  (**(code **)(local_70->_M_pod_data + 0x18))(local_70,&local_a8.block,&local_b0);
                  uVar9 = pBVar3->id_;
                  break;
                }
              }
            }
            if (*(__node_base_ptr *)(local_68._0_8_ + ((ulong)uVar9 % (ulong)local_68._8_8_) * 8) !=
                (__node_base_ptr)0x0) {
              p_Var4 = (*(__node_base_ptr *)
                         (local_68._0_8_ + ((ulong)uVar9 % (ulong)local_68._8_8_) * 8))->_M_nxt;
              uVar1 = *(uint *)&p_Var4[1]._M_nxt;
              do {
                if (uVar9 == uVar1) goto LAB_001ae61d;
                p_Var4 = p_Var4->_M_nxt;
              } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                      (uVar1 = *(uint *)&p_Var4[1]._M_nxt,
                      (ulong)uVar1 % (ulong)local_68._8_8_ == (ulong)uVar9 % (ulong)local_68._8_8_))
              ;
            }
            local_a8.block = pBVar3;
            if ((*(long *)(local_78 + 1) == 0) ||
               ((**(code **)(local_78->_M_pod_data + 0x18))(local_78,&local_a8.block),
               local_b0 = pBVar3, local_a8.block = pBVar3,
               (successor_func->super__Function_base)._M_manager == (_Manager_type)0x0))
            goto LAB_001ae65e;
            pvVar7 = (*successor_func->_M_invoker)((_Any_data *)successor_func,&local_b0);
            ppBVar2 = (pvVar7->
                      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_a8.iter._M_current = ppBVar2;
            if (local_98.
                super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
              ::_M_realloc_insert<spvtools::CFA<spvtools::val::BasicBlock>::block_info>
                        (&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_a8);
            }
            else {
              local_a8.iter._M_current._0_4_ = SUB84(ppBVar2,0);
              local_a8.iter._M_current._4_4_ = (undefined4)((ulong)ppBVar2 >> 0x20);
              *(undefined4 *)
               &(local_98.
                 super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->block = local_a8.block._0_4_;
              *(undefined4 *)
               ((long)&(local_98.
                        super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->block + 4) =
                   local_a8.block._4_4_;
              *(undefined4 *)
               &((local_98.
                  super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->iter)._M_current =
                   local_a8.iter._M_current._0_4_;
              *(undefined4 *)
               ((long)&((local_98.
                         super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->iter)._M_current + 4) =
                   local_a8.iter._M_current._4_4_;
              local_98.
              super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_b0 = (BasicBlock *)CONCAT44(local_b0._4_4_,pBVar3->id_);
            local_a8.block = (cbb_ptr)local_68;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_a8.block,&local_b0,&local_a8);
          }
LAB_001ae61d:
        } while (local_98.
                 super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_98.
                 super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_98.
          super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
          ._M_impl.super__Vector_impl_data._M_start != (block_info *)0x0) {
        operator_delete(local_98.
                        super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<spvtools::CFA<spvtools::val::BasicBlock>::block_info,_std::allocator<spvtools::CFA<spvtools::val::BasicBlock>::block_info>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_68);
      return;
    }
  }
LAB_001ae65e:
  std::__throw_bad_function_call();
}

Assistant:

void CFA<BB>::DepthFirstTraversal(
    const BB* entry, get_blocks_func successor_func,
    std::function<void(cbb_ptr)> preorder,
    std::function<void(cbb_ptr)> postorder,
    std::function<void(cbb_ptr, cbb_ptr)> backedge,
    std::function<bool(cbb_ptr)> terminal) {
  assert(successor_func && "The successor function cannot be empty.");
  assert(preorder && "The preorder function cannot be empty.");
  assert(postorder && "The postorder function cannot be empty.");
  assert(terminal && "The terminal function cannot be empty.");

  std::unordered_set<uint32_t> processed;

  /// NOTE: work_list is the sequence of nodes from the root node to the node
  /// being processed in the traversal
  std::vector<block_info> work_list;
  work_list.reserve(10);

  work_list.push_back({entry, std::begin(*successor_func(entry))});
  preorder(entry);
  processed.insert(entry->id());

  while (!work_list.empty()) {
    block_info& top = work_list.back();
    if (terminal(top.block) || top.iter == end(*successor_func(top.block))) {
      postorder(top.block);
      work_list.pop_back();
    } else {
      BB* child = *top.iter;
      top.iter++;
      if (backedge && FindInWorkList(work_list, child->id())) {
        backedge(top.block, child);
      }
      if (processed.count(child->id()) == 0) {
        preorder(child);
        work_list.emplace_back(
            block_info{child, std::begin(*successor_func(child))});
        processed.insert(child->id());
      }
    }
  }
}